

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeFunction *
GetGenericFunctionInstanceType
          (ExpressionContext *ctx,SynBase *source,TypeBase *parentType,FunctionData *function,
          ArrayView<CallArgumentData> arguments,IntrusiveList<MatchData> *aliases)

{
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  *this;
  __jmp_buf_tag *__env;
  SynIdentifier *pSVar1;
  SynBase *pSVar2;
  ArgumentData *pAVar3;
  IntrusiveList<MatchData> aliases_00;
  IntrusiveList<TypeHandle> arguments_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  MatchData *pMVar8;
  GenericFunctionInstanceTypeResponse *pGVar9;
  SynFunctionDefinition *pSVar10;
  TypeBase *pTVar11;
  undefined4 extraout_var_01;
  ulong uVar12;
  TypeFunction *pTVar13;
  TypeBase *actualType;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar14;
  SynFunctionArgument *source_00;
  ulong uVar15;
  uint uVar16;
  CallArgumentData *pCVar17;
  uint uVar18;
  MatchData *pMVar19;
  MatchData *pMVar20;
  ExprBase **ppEVar21;
  IntrusiveList<TypeHandle> arguments_01;
  IntrusiveList<TypeHandle> types;
  IntrusiveList<TypeHandle> incomingArguments;
  IntrusiveList<MatchData> incomingAliases;
  GenericFunctionInstanceTypeRequest request;
  jmp_buf prevErrorHandler;
  IntrusiveList<TypeHandle> local_1a8;
  TypeBase *local_190;
  ScopeData *local_188;
  GenericFunctionInstanceTypeResponse local_180;
  IntrusiveList<TypeHandle> local_168;
  long local_158;
  __jmp_buf_tag *local_150;
  IntrusiveList<MatchData> local_148;
  GenericFunctionInstanceTypeRequest local_130;
  undefined1 local_f8 [200];
  TypeHandle *pTVar7;
  undefined4 extraout_var_00;
  
  pCVar17 = arguments.data;
  uVar18 = arguments.count;
  if ((function->arguments).count != uVar18) {
    __assert_fail("function->arguments.size() == arguments.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x188b,
                  "TypeFunction *GetGenericFunctionInstanceType(ExpressionContext &, SynBase *, TypeBase *, FunctionData *, ArrayView<CallArgumentData>, IntrusiveList<MatchData> &)"
                 );
  }
  local_168.head = (TypeHandle *)0x0;
  local_168.tail = (TypeHandle *)0x0;
  local_148.head = (MatchData *)0x0;
  local_148.tail = (MatchData *)0x0;
  local_190 = parentType;
  if (uVar18 != 0) {
    lVar14 = 0;
    do {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      pTVar7 = (TypeHandle *)CONCAT44(extraout_var,iVar6);
      pTVar7->type = *(TypeBase **)((long)&pCVar17->type + lVar14);
      pTVar7->next = (TypeHandle *)0x0;
      pTVar7->listed = false;
      IntrusiveList<TypeHandle>::push_back(&local_168,pTVar7);
      lVar14 = lVar14 + 0x10;
    } while ((ulong)uVar18 << 4 != lVar14);
  }
  pMVar19 = aliases->head;
  if (pMVar19 != (MatchData *)0x0) {
    do {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pMVar8 = (MatchData *)CONCAT44(extraout_var_00,iVar6);
      pSVar1 = pMVar19->name;
      pTVar11 = pMVar19->type;
      pMVar8->name = pSVar1;
      pMVar8->type = pTVar11;
      pMVar8->next = (MatchData *)0x0;
      pMVar8->listed = false;
      if (pSVar1 == (SynIdentifier *)0x0) {
        __assert_fail("name",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                      ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
      }
      IntrusiveList<MatchData>::push_back(&local_148,pMVar8);
      pMVar19 = pMVar19->next;
    } while (pMVar19 != (MatchData *)0x0);
  }
  arguments_00.tail = local_168.tail;
  arguments_00.head = local_168.head;
  aliases_00.tail._0_4_ = (int)local_148.tail;
  aliases_00.head = local_148.head;
  aliases_00.tail._4_4_ = (int)((ulong)local_148.tail >> 0x20);
  GenericFunctionInstanceTypeRequest::GenericFunctionInstanceTypeRequest
            (&local_130,local_190,function,arguments_00,aliases_00);
  this = &ctx->genericFunctionInstanceTypeMap;
  pGVar9 = SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
           ::find(this,&local_130);
  if (pGVar9 == (GenericFunctionInstanceTypeResponse *)0x0) {
    local_188 = ctx->scope;
    pSVar2 = function->source;
    ctx->scope = function->scope;
    ctx->lookupLocation = pSVar2;
    local_1a8.head = (TypeHandle *)0x0;
    local_1a8.tail = (TypeHandle *)0x0;
    __env = ctx->errorHandler;
    memcpy(local_f8,__env,200);
    bVar5 = ctx->errorHandlerNested;
    ctx->errorHandlerNested = true;
    uVar16 = *(uint *)(NULLC::traceContext + 0x244);
    iVar6 = _setjmp((__jmp_buf_tag *)__env);
    if (iVar6 != 0) {
      NULLC::TraceLeaveTo(uVar16);
      ctx->scope = local_188;
      ctx->lookupLocation = (SynBase *)0x0;
      memcpy(__env,local_f8,200);
      ctx->errorHandlerNested = bVar5;
      longjmp((__jmp_buf_tag *)__env,1);
    }
    pSVar10 = GetGenericFunctionDefinition(ctx,source,function);
    local_150 = __env;
    if (pSVar10 == (SynFunctionDefinition *)0x0) {
      if (function->importModule != (ModuleData *)0x0) {
        anon_unknown.dwarf_c3752::Stop
                  (ctx,source,"ERROR: imported generic function call is not supported");
      }
      if ((function->arguments).count != 0) {
        ppEVar21 = &pCVar17->value;
        uVar12 = 0;
        uVar15 = uVar12;
        do {
          if (uVar18 == uVar12) goto LAB_00170cb8;
          pAVar3 = (function->arguments).data;
          pTVar11 = MatchArgumentType(ctx,*(SynBase **)((long)&pAVar3->source + uVar15),
                                      *(TypeBase **)((long)&pAVar3->type + uVar15),
                                      ((CallArgumentData *)(ppEVar21 + -1))->type,*ppEVar21,aliases)
          ;
          if ((pTVar11 == (TypeBase *)0x0) || (pTVar11->typeID == 0)) {
            local_180.aliases.head = aliases->head;
            local_180.aliases.tail = aliases->tail;
            goto LAB_00170c71;
          }
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pTVar7 = (TypeHandle *)CONCAT44(extraout_var_01,iVar6);
          pTVar7->type = pTVar11;
          pTVar7->next = (TypeHandle *)0x0;
          pTVar7->listed = false;
          IntrusiveList<TypeHandle>::push_back(&local_1a8,pTVar7);
          uVar12 = uVar12 + 1;
          uVar15 = uVar15 + 0x30;
          ppEVar21 = ppEVar21 + 2;
        } while (uVar12 < (function->arguments).count);
      }
    }
    else {
      bVar4 = RestoreParentTypeScope(ctx,source,local_190);
      ExpressionContext::PushTemporaryScope(ctx);
      source_00 = (pSVar10->arguments).head;
      if (source_00 != (SynFunctionArgument *)0x0) {
        local_180.functionType =
             (TypeFunction *)((ulong)local_180.functionType & 0xffffffffffffff00);
        pTVar11 = AnalyzeType(ctx,source_00->type,true,(bool *)&local_180);
        if ((char)local_180.functionType == '\0') {
          local_158 = (ulong)uVar18 * 0x10 + 0x10;
          lVar14 = 0;
          do {
            if (local_158 == lVar14 + 0x10) {
LAB_00170cb8:
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x22a,
                            "T &ArrayView<CallArgumentData>::operator[](unsigned int) [T = CallArgumentData]"
                           );
            }
            actualType = *(TypeBase **)((long)&pCVar17->type + lVar14);
            if (pTVar11 != ctx->typeAuto) {
              actualType = MatchArgumentType(ctx,&source_00->super_SynBase,pTVar11,actualType,
                                             *(ExprBase **)((long)&pCVar17->value + lVar14),aliases)
              ;
            }
            if ((actualType == (TypeBase *)0x0) || (actualType->typeID == 0)) break;
            iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
            pSVar1 = source_00->name;
            uVar16 = ctx->uniqueVariableId;
            ctx->uniqueVariableId = uVar16 + 1;
            VariableData::VariableData
                      ((VariableData *)CONCAT44(extraout_var_02,iVar6),ctx->allocator,
                       &source_00->super_SynBase,ctx->scope,0,actualType,pSVar1,0,uVar16);
            ExpressionContext::AddVariable(ctx,(VariableData *)CONCAT44(extraout_var_02,iVar6),true)
            ;
            iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
            pTVar7 = (TypeHandle *)CONCAT44(extraout_var_03,iVar6);
            pTVar7->type = actualType;
            pTVar7->next = (TypeHandle *)0x0;
            pTVar7->listed = false;
            IntrusiveList<TypeHandle>::push_back(&local_1a8,pTVar7);
            source_00 = (SynFunctionArgument *)(source_00->super_SynBase).next;
            if ((source_00 == (SynFunctionArgument *)0x0) ||
               ((source_00->super_SynBase).typeID != 0x36)) break;
            local_180.functionType =
                 (TypeFunction *)((ulong)local_180.functionType & 0xffffffffffffff00);
            pTVar11 = AnalyzeType(ctx,source_00->type,true,(bool *)&local_180);
            lVar14 = lVar14 + 0x10;
            if ((char)local_180.functionType != '\0') break;
          } while( true );
        }
      }
      ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY,true);
      if (bVar4) {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
      }
    }
    ctx->scope = local_188;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(local_150,local_f8,200);
    ctx->errorHandlerNested = bVar5;
    if (local_1a8.head == (TypeHandle *)0x0) {
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      pTVar7 = local_1a8.head;
      do {
        uVar16 = uVar16 + 1;
        pTVar7 = pTVar7->next;
      } while (pTVar7 != (TypeHandle *)0x0);
    }
    if (uVar16 == uVar18) {
      pMVar19 = (function->generics).head;
      if (pMVar19 != (MatchData *)0x0) {
        pMVar8 = (MatchData *)0x0;
        do {
          pMVar20 = aliases->head;
          if (pMVar20 == (MatchData *)0x0) {
LAB_00170ade:
            local_180.aliases.tail = aliases->tail;
            local_180.aliases.head = pMVar8;
            goto LAB_00170c71;
          }
          while (bVar5 = InplaceStr::operator==(&pMVar19->name->name,&pMVar20->name->name), !bVar5)
          {
            pMVar20 = pMVar20->next;
            if (pMVar20 == (MatchData *)0x0) {
              pMVar8 = aliases->head;
              goto LAB_00170ade;
            }
          }
          pMVar19 = pMVar19->next;
        } while (pMVar19 != (MatchData *)0x0);
      }
      arguments_01.tail = local_1a8.tail;
      arguments_01.head = local_1a8.head;
      pTVar13 = ExpressionContext::GetFunctionType
                          (ctx,source,function->type->returnType,arguments_01);
      local_180.aliases.head = aliases->head;
      local_180.aliases.tail = aliases->tail;
      local_180.functionType = pTVar13;
      SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
      ::insert(this,&local_130,&local_180);
    }
    else {
      local_180.aliases.tail = aliases->tail;
      local_180.aliases.head = aliases->head;
LAB_00170c71:
      local_180.functionType = (TypeFunction *)0x0;
      SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
      ::insert(this,&local_130,&local_180);
      pTVar13 = (TypeFunction *)0x0;
    }
  }
  else {
    pMVar19 = (pGVar9->aliases).tail;
    aliases->head = (pGVar9->aliases).head;
    aliases->tail = pMVar19;
    pTVar13 = pGVar9->functionType;
  }
  return pTVar13;
}

Assistant:

TypeFunction* GetGenericFunctionInstanceType(ExpressionContext &ctx, SynBase *source, TypeBase *parentType, FunctionData *function, ArrayView<CallArgumentData> arguments, IntrusiveList<MatchData> &aliases)
{
	assert(function->arguments.size() == arguments.size());

	// Lookup previous match for this function
	IntrusiveList<TypeHandle> incomingArguments;
	IntrusiveList<MatchData> incomingAliases;

	for(unsigned i = 0; i < arguments.size(); i++)
		incomingArguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(arguments[i].type));

	for(MatchData *curr = aliases.head; curr; curr = curr->next)
		incomingAliases.push_back(new (ctx.get<MatchData>()) MatchData(curr->name, curr->type));

	GenericFunctionInstanceTypeRequest request(parentType, function, incomingArguments, incomingAliases);

	if(GenericFunctionInstanceTypeResponse* response = ctx.genericFunctionInstanceTypeMap.find(request))
	{
		aliases = response->aliases;

		return response->functionType;
	}

	// Switch to original function scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(function->scope, function->source);

	IntrusiveList<TypeHandle> types;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		if(SynFunctionDefinition *syntax = GetGenericFunctionDefinition(ctx, source, function))
		{
			bool addedParentScope = RestoreParentTypeScope(ctx, source, parentType);

			// Create temporary scope with known arguments for reference in type expression
			ctx.PushTemporaryScope();

			unsigned pos = 0;

			for(SynFunctionArgument *argument = syntax->arguments.head; argument; argument = getType<SynFunctionArgument>(argument->next), pos++)
			{
				bool failed = false;
				TypeBase *expectedType = AnalyzeType(ctx, argument->type, true, &failed);

				if(failed)
					break;

				CallArgumentData &actualArgument = arguments[pos];

				TypeBase *type = expectedType == ctx.typeAuto ? actualArgument.type : MatchArgumentType(ctx, argument, expectedType, actualArgument.type, actualArgument.value, aliases);

				if(!type || isType<TypeError>(type))
					break;

				ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, argument, ctx.scope, 0, type, argument->name, 0, ctx.uniqueVariableId++), true);

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}

			ctx.PopScope(SCOPE_TEMPORARY);

			if(addedParentScope)
				ctx.PopScope(SCOPE_TYPE);
		}
		else
		{
			if(function->importModule)
				Stop(ctx, source, "ERROR: imported generic function call is not supported");

			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &funtionArgument = function->arguments[i];

				CallArgumentData &actualArgument = arguments[i];

				TypeBase *type = MatchArgumentType(ctx, funtionArgument.source, funtionArgument.type, actualArgument.type, actualArgument.value, aliases);

				if(!type || isType<TypeError>(type))
				{
					ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

					// TODO: what about scope restore
					return NULL;
				}

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}
		}
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	if(types.size() != arguments.size())
	{
		ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

		return NULL;
	}

	// Check that all generics have been resolved
	for(MatchData *curr = function->generics.head; curr; curr = curr->next)
	{
		bool matched = false;

		for(MatchData *alias = aliases.head; alias; alias = alias->next)
		{
			if(curr->name->name == alias->name->name)
			{
				matched = true;
				break;
			}
		}

		if(!matched)
		{
			ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

			return NULL;
		}
	}

	TypeFunction *typeFunction = ctx.GetFunctionType(source, function->type->returnType, types);

	ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(typeFunction, aliases));

	return typeFunction;
}